

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O0

void __thiscall
ncnn::ConvolutionDepthWise_x86_avx::ConvolutionDepthWise_x86_avx(ConvolutionDepthWise_x86_avx *this)

{
  long *in_RDI;
  ConvolutionDepthWise *unaff_retaddr;
  
  ConvolutionDepthWise::ConvolutionDepthWise(unaff_retaddr);
  *in_RDI = (long)&PTR_create_pipeline_009b9ad8;
  in_RDI[0x17] = (long)&PTR__ConvolutionDepthWise_x86_avx_009b9b60;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::vector
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)0x663d9a);
  ncnn::Mat::Mat((Mat *)(in_RDI + 5));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0xe));
  *(undefined1 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb) = 1;
  in_RDI[1] = 0;
  return;
}

Assistant:

ConvolutionDepthWise_x86_avx::ConvolutionDepthWise_x86_avx()
{
#if __SSE2__
    support_packing = true;
#if __AVX2__
    support_weight_fp16_storage = true;
#endif
#endif // __SSE2__
    activation = 0;
}